

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O1

void multiply10(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  AssertionHandler catchAssertionHandler;
  undefined4 local_d0;
  int local_cc;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  int *local_a8;
  char *local_a0;
  size_t sStack_98;
  undefined4 *local_90;
  AssertionHandler local_88;
  StringRef local_40;
  
  local_b8._vptr_ITransientExpression = (_func_int **)0x18546e;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 8;
  local_cc = argc;
  Catch::StringRef::StringRef(&local_40,"argc == 1");
  Catch::AssertionHandler::AssertionHandler
            (&local_88,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  iVar1 = local_cc;
  local_d0 = 1;
  Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
  local_b8.m_result = iVar1 == 1;
  local_b8.m_isBinaryExpression = true;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b6c70;
  local_a0 = local_c8.file;
  sStack_98 = local_c8.line;
  local_a8 = &local_cc;
  local_90 = &local_d0;
  Catch::AssertionHandler::handleExpr(&local_88,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  iVar1 = duckdb_shell_sqlite3_value_int(*argv);
  duckdb_shell_sqlite3_result_int(context,iVar1 * 10);
  return;
}

Assistant:

static void multiply10(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc == 1);
	int v = sqlite3_value_int(argv[0]);
	v *= 10;
	sqlite3_result_int(context, v);
}